

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode JsHasOwnItem(JsValueRef object,uint32_t index,bool *hasOwnItem)

{
  anon_class_24_3_8fdd9459 fn;
  JsErrorCode JVar1;
  uint32_t *in_stack_ffffffffffffffc0;
  bool *local_20;
  bool *hasOwnItem_local;
  JsValueRef pvStack_10;
  uint32_t index_local;
  JsValueRef object_local;
  
  fn.hasOwnItem = (bool **)((long)&hasOwnItem_local + 4);
  fn.object = &local_20;
  fn.index = in_stack_ffffffffffffffc0;
  local_20 = hasOwnItem;
  hasOwnItem_local._4_4_ = index;
  pvStack_10 = object;
  JVar1 = ContextAPIWrapper<true,JsHasOwnItem::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API
JsHasOwnItem(_In_ JsValueRef object,
    _In_ uint32_t index,
    _Out_ bool* hasOwnItem)
{
  return ContextAPIWrapper<true>(
      [&](Js::ScriptContext* scriptContext,
          TTDRecorder& _actionEntryPopper) -> JsErrorCode {

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        PARAM_NOT_NULL(hasOwnItem);

        *hasOwnItem = !!Js::JavascriptOperators::HasOwnItem(
            Js::VarTo<Js::RecyclableObject>(object), index);

        return JsNoError;
      });
}